

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

Expression * __thiscall
wasm::OptimizeInstructions::optimizeMemoryFill(OptimizeInstructions *this,MemoryFill *memFill)

{
  Id IVar1;
  PassRunner *pPVar2;
  Module *pMVar3;
  Expression *pEVar4;
  Name memory;
  Index index;
  int64_t iVar5;
  Block *pBVar6;
  LocalSet *ptr;
  Const *pCVar7;
  Expression *pEVar8;
  Store *pSVar9;
  ulong extraout_RDX;
  ulong uVar10;
  ulong extraout_RDX_00;
  uint bytes;
  Type in_R8;
  uchar __tmp;
  unsigned_long x;
  undefined1 auVar11 [16];
  optional<wasm::Type> type;
  Type TVar12;
  size_t sVar13;
  char *pcVar14;
  Store *local_68;
  Store *local_60;
  undefined1 auStack_58 [8];
  uint8_t values [16];
  Builder local_38;
  Builder builder;
  
  if (((memFill->super_SpecificExpression<(wasm::Expression::Id)39>).super_Expression.type.id == 1)
     || (memFill->size->_id != ConstId)) {
    return (Expression *)0x0;
  }
  pPVar2 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).super_Pass.runner;
  pMVar3 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).
           super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .
           super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .currModule;
  local_38.wasm = pMVar3;
  iVar5 = Literal::getInteger((Literal *)(memFill->size + 1));
  if (iVar5 == 0) {
    if (((pPVar2->options).ignoreImplicitTraps != false) ||
       ((pPVar2->options).trapsNeverHappen == true)) {
      pEVar8 = memFill->dest;
      pSVar9 = (Store *)MixedArena::allocSpace(&pMVar3->allocator,0x18,8);
      (((SpecificExpression<(wasm::Expression::Id)18> *)
       &pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>)->super_Expression)._id = DropId;
      (((SpecificExpression<(wasm::Expression::Id)18> *)
       &pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>)->super_Expression).type.id = 0;
      *(Expression **)&pSVar9->bytes = pEVar8;
      Drop::finalize((Drop *)pSVar9);
      pEVar8 = memFill->value;
      local_68 = pSVar9;
      pSVar9 = (Store *)MixedArena::allocSpace(&pMVar3->allocator,0x18,8);
      (((SpecificExpression<(wasm::Expression::Id)18> *)
       &pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>)->super_Expression)._id = DropId;
      (((SpecificExpression<(wasm::Expression::Id)18> *)
       &pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>)->super_Expression).type.id = 0;
      *(Expression **)&pSVar9->bytes = pEVar8;
      Drop::finalize((Drop *)pSVar9);
      uVar10 = extraout_RDX;
      local_60 = pSVar9;
      goto LAB_009d46fb;
    }
    pEVar8 = memFill->value;
    if (pEVar8->_id != ConstId) {
      return (Expression *)0x0;
    }
  }
  else {
    pEVar8 = memFill->value;
    if (pEVar8->_id != ConstId) {
      if (iVar5 != 1) {
        return (Expression *)0x0;
      }
      pEVar4 = memFill->dest;
      auStack_58 = (undefined1  [8])(memFill->memory).super_IString.str._M_len;
      values._0_8_ = (memFill->memory).super_IString.str._M_str;
      pSVar9 = (Store *)MixedArena::allocSpace(&pMVar3->allocator,0x58,8);
      *(undefined8 *)&(pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression
           = 0;
      (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
      *(undefined8 *)&pSVar9->bytes = 0;
      (pSVar9->offset).addr = 0;
      (pSVar9->align).addr = 0;
      *(undefined8 *)&pSVar9->isAtomic = 0;
      (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
      pSVar9->bytes = '\x01';
      (pSVar9->align).addr = 1;
      pSVar9->ptr = pEVar4;
      pSVar9->value = pEVar8;
      (pSVar9->valueType).id = 2;
      (pSVar9->memory).super_IString.str._M_len = (size_t)auStack_58;
      (pSVar9->memory).super_IString.str._M_str = (char *)values._0_8_;
      Store::finalize(pSVar9);
      return (Expression *)pSVar9;
    }
  }
  if (*(long *)(pEVar8 + 2) != 2) {
    __assert_fail("type == Type::i32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                  ,0x120,"int32_t wasm::Literal::geti32() const");
  }
  IVar1 = pEVar8[1]._id;
  switch(iVar5) {
  case 1:
    pEVar8 = memFill->dest;
    pCVar7 = Builder::makeConst<unsigned_int>(&local_38,(uint)IVar1);
    sVar13 = (memFill->memory).super_IString.str._M_len;
    pcVar14 = (memFill->memory).super_IString.str._M_str;
    TVar12.id = 2;
    bytes = 1;
    break;
  case 2:
    pEVar8 = memFill->dest;
    pCVar7 = Builder::makeConst<unsigned_int>(&local_38,(uint)CONCAT11(IVar1,IVar1));
    sVar13 = (memFill->memory).super_IString.str._M_len;
    pcVar14 = (memFill->memory).super_IString.str._M_str;
    TVar12.id = 2;
    bytes = 2;
    break;
  case 3:
  case 5:
  case 6:
  case 7:
    return (Expression *)0x0;
  case 4:
    if ((IVar1 != InvalidId) && ((pPVar2->options).shrinkLevel != 0)) {
      return (Expression *)0x0;
    }
    pEVar8 = memFill->dest;
    pCVar7 = Builder::makeConst<unsigned_int>(&local_38,(uint)IVar1 * 0x1010101);
    sVar13 = (memFill->memory).super_IString.str._M_len;
    pcVar14 = (memFill->memory).super_IString.str._M_str;
    TVar12.id = 2;
    bytes = 4;
    break;
  case 8:
    if ((IVar1 != InvalidId) && ((pPVar2->options).shrinkLevel != 0)) {
      return (Expression *)0x0;
    }
    pEVar8 = memFill->dest;
    pCVar7 = Builder::makeConst<unsigned_long>(&local_38,(ulong)IVar1 * 0x101010101010101);
    sVar13 = (memFill->memory).super_IString.str._M_len;
    pcVar14 = (memFill->memory).super_IString.str._M_str;
    TVar12.id = 3;
    bytes = 8;
    break;
  default:
    if (iVar5 != 0x10) {
      return (Expression *)0x0;
    }
    if ((pPVar2->options).shrinkLevel != 0) {
      return (Expression *)0x0;
    }
    if (((((this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).
           super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .
           super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
          .currModule)->features).features & 8) == 0) {
      TVar12.id = (memFill->dest->type).id;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = TVar12.id;
      index = Builder::addVar((Builder *)
                              (this->
                              super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                              ).
                              super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                              .
                              super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                              .currFunction,(Function *)0x0,(Name)(auVar11 << 0x40),in_R8);
      ptr = Builder::makeLocalTee(&local_38,index,memFill->dest,TVar12);
      x = (ulong)IVar1 * 0x101010101010101;
      pCVar7 = Builder::makeConst<unsigned_long>(&local_38,x);
      local_68 = Builder::makeStore(&local_38,8,(Address)0x0,1,(Expression *)ptr,
                                    (Expression *)pCVar7,(Type)0x3,
                                    (Name)(memFill->memory).super_IString.str);
      pEVar8 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      pEVar8->_id = LocalGetId;
      *(Index *)(pEVar8 + 1) = index;
      (pEVar8->type).id = TVar12.id;
      pCVar7 = Builder::makeConst<unsigned_long>(&local_38,x);
      local_60 = Builder::makeStore(&local_38,8,(Address)0x8,1,pEVar8,(Expression *)pCVar7,(Type)0x3
                                    ,(Name)(memFill->memory).super_IString.str);
      uVar10 = extraout_RDX_00;
LAB_009d46fb:
      auStack_58 = (undefined1  [8])&local_68;
      values[0] = '\x02';
      values[1] = '\0';
      values[2] = '\0';
      values[3] = '\0';
      values[4] = '\0';
      values[5] = '\0';
      values[6] = '\0';
      values[7] = '\0';
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar10;
      pBVar6 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                         (&local_38,(initializer_list<wasm::Expression_*> *)auStack_58,type);
      return (Expression *)pBVar6;
    }
    auVar11 = pshuflw(ZEXT216(CONCAT11(IVar1,IVar1)),ZEXT216(CONCAT11(IVar1,IVar1)),0);
    auStack_58._4_4_ = auVar11._0_4_;
    auStack_58._0_4_ = auStack_58._4_4_;
    values[4] = (char)auStack_58._4_4_;
    values[5] = (char)((uint)auStack_58._4_4_ >> 8);
    values[6] = (char)((uint)auStack_58._4_4_ >> 0x10);
    values[7] = (char)((uint)auStack_58._4_4_ >> 0x18);
    values[0] = (char)auStack_58._4_4_;
    values[1] = (char)((uint)auStack_58._4_4_ >> 8);
    values[2] = (char)((uint)auStack_58._4_4_ >> 0x10);
    values[3] = (char)((uint)auStack_58._4_4_ >> 0x18);
    pEVar8 = memFill->dest;
    pCVar7 = Builder::makeConst<unsigned_char[16]>(&local_38,auStack_58);
    sVar13 = (memFill->memory).super_IString.str._M_len;
    pcVar14 = (memFill->memory).super_IString.str._M_str;
    TVar12.id = 6;
    bytes = 0x10;
  }
  memory.super_IString.str._M_str = pcVar14;
  memory.super_IString.str._M_len = sVar13;
  pSVar9 = Builder::makeStore(&local_38,bytes,(Address)0x0,1,pEVar8,(Expression *)pCVar7,TVar12,
                              memory);
  return (Expression *)pSVar9;
}

Assistant:

Expression* optimizeMemoryFill(MemoryFill* memFill) {
    if (memFill->type == Type::unreachable) {
      return nullptr;
    }

    if (!memFill->size->is<Const>()) {
      return nullptr;
    }

    auto& options = getPassOptions();
    Builder builder(*getModule());

    auto* csize = memFill->size->cast<Const>();
    auto bytes = csize->value.getInteger();

    if (bytes == 0LL &&
        (options.ignoreImplicitTraps || options.trapsNeverHappen)) {
      // memory.fill(d, v, 0)  ==>  { drop(d), drop(v) }
      return builder.makeBlock(
        {builder.makeDrop(memFill->dest), builder.makeDrop(memFill->value)});
    }

    const uint32_t offset = 0, align = 1;

    if (auto* cvalue = memFill->value->dynCast<Const>()) {
      uint32_t value = cvalue->value.geti32() & 0xFF;
      // memory.fill(d, C1, C2)  ==>
      //   store(d, (C1 & 0xFF) * (-1U / max(bytes)))
      switch (bytes) {
        case 1: {
          return builder.makeStore(1, // bytes
                                   offset,
                                   align,
                                   memFill->dest,
                                   builder.makeConst<uint32_t>(value),
                                   Type::i32,
                                   memFill->memory);
        }
        case 2: {
          return builder.makeStore(2,
                                   offset,
                                   align,
                                   memFill->dest,
                                   builder.makeConst<uint32_t>(value * 0x0101U),
                                   Type::i32,
                                   memFill->memory);
        }
        case 4: {
          // transform only when "value" or shrinkLevel equal to zero due to
          // it could increase size by several bytes
          if (value == 0 || options.shrinkLevel == 0) {
            return builder.makeStore(
              4,
              offset,
              align,
              memFill->dest,
              builder.makeConst<uint32_t>(value * 0x01010101U),
              Type::i32,
              memFill->memory);
          }
          break;
        }
        case 8: {
          // transform only when "value" or shrinkLevel equal to zero due to
          // it could increase size by several bytes
          if (value == 0 || options.shrinkLevel == 0) {
            return builder.makeStore(
              8,
              offset,
              align,
              memFill->dest,
              builder.makeConst<uint64_t>(value * 0x0101010101010101ULL),
              Type::i64,
              memFill->memory);
          }
          break;
        }
        case 16: {
          if (options.shrinkLevel == 0) {
            if (getModule()->features.hasSIMD()) {
              uint8_t values[16];
              std::fill_n(values, 16, (uint8_t)value);
              return builder.makeStore(16,
                                       offset,
                                       align,
                                       memFill->dest,
                                       builder.makeConst<uint8_t[16]>(values),
                                       Type::v128,
                                       memFill->memory);
            } else {
              // { i64.store(d, C', 0), i64.store(d, C', 8) }
              auto destType = memFill->dest->type;
              Index tempLocal = builder.addVar(getFunction(), destType);
              return builder.makeBlock({
                builder.makeStore(
                  8,
                  offset,
                  align,
                  builder.makeLocalTee(tempLocal, memFill->dest, destType),
                  builder.makeConst<uint64_t>(value * 0x0101010101010101ULL),
                  Type::i64,
                  memFill->memory),
                builder.makeStore(
                  8,
                  offset + 8,
                  align,
                  builder.makeLocalGet(tempLocal, destType),
                  builder.makeConst<uint64_t>(value * 0x0101010101010101ULL),
                  Type::i64,
                  memFill->memory),
              });
            }
          }
          break;
        }
        default: {
        }
      }
    }
    // memory.fill(d, v, 1)  ==>  store8(d, v)
    if (bytes == 1LL) {
      return builder.makeStore(1,
                               offset,
                               align,
                               memFill->dest,
                               memFill->value,
                               Type::i32,
                               memFill->memory);
    }

    return nullptr;
  }